

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionObservationHistory.cpp
# Opt level: O0

void __thiscall
JointActionObservationHistory::GetJointActionObservationHistoryVectors
          (JointActionObservationHistory *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *jaIs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *joIs)

{
  bool bVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  reverse_iterator it_1;
  reverse_iterator it;
  vector<unsigned_int,_std::allocator<unsigned_int>_> joIsReversed;
  vector<unsigned_int,_std::allocator<unsigned_int>_> jaIsReversed;
  reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_ffffffffffffff28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff38;
  JointActionObservationHistory *in_stack_ffffffffffffff40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78 [4];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_18;
  
  local_18 = in_RDX;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x9b10be);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x9b10d0);
  GetJointActionObservationHistoryVectorsRecursive
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::rbegin(in_stack_ffffffffffffff38);
  while( true ) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::rend(in_stack_ffffffffffffff38);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if (!bVar1) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)in_stack_ffffffffffffff30);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff40,
               (value_type_conflict1 *)in_stack_ffffffffffffff38);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)in_stack_ffffffffffffff30);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::rbegin(in_stack_ffffffffffffff38);
  while( true ) {
    this_00 = local_78;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::rend(in_stack_ffffffffffffff38);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if (!bVar1) break;
    in_stack_ffffffffffffff30 = local_18;
    in_stack_ffffffffffffff38 =
         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
         std::
         reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      *)local_18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (this_00,(value_type_conflict1 *)in_stack_ffffffffffffff38);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)in_stack_ffffffffffffff30);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this_00);
  return;
}

Assistant:

void 
JointActionObservationHistory::GetJointActionObservationHistoryVectors(
//    JointActionObservationHistory *joah,
    vector<Index> &jaIs, vector<Index> &joIs)
{
    vector<Index> jaIsReversed;
    vector<Index> joIsReversed;

    GetJointActionObservationHistoryVectorsRecursive( jaIsReversed,
            joIsReversed);

    // reverse both vectors
    for(vector<Index>::reverse_iterator it=jaIsReversed.rbegin();
        it!=jaIsReversed.rend(); ++it)
        jaIs.push_back(*it);

    for(vector<Index>::reverse_iterator it=joIsReversed.rbegin();
        it!=joIsReversed.rend(); ++it)
        joIs.push_back(*it);

#if DEBUG_JAOH
    cout << SoftPrint() << " " << SoftPrintVector(jaIsReversed) << " "
         << SoftPrintVector(joIsReversed) << endl;
#endif
}